

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget.cxx
# Opt level: O0

void __thiscall Fl_Widget::hide(Fl_Widget *this)

{
  int iVar1;
  Fl_Boxtype FVar2;
  Fl_Group *pFVar3;
  Fl_Group *local_18;
  Fl_Widget *p;
  Fl_Widget *this_local;
  
  iVar1 = visible_r(this);
  if (iVar1 == 0) {
    set_flag(this,2);
  }
  else {
    set_flag(this,2);
    for (local_18 = parent(this); local_18 != (Fl_Group *)0x0;
        local_18 = parent(&local_18->super_Fl_Widget)) {
      FVar2 = box(&local_18->super_Fl_Widget);
      if (FVar2 != FL_NO_BOX) {
LAB_00234b4d:
        redraw(&local_18->super_Fl_Widget);
        break;
      }
      pFVar3 = parent(&local_18->super_Fl_Widget);
      if (pFVar3 == (Fl_Group *)0x0) goto LAB_00234b4d;
    }
    (*this->_vptr_Fl_Widget[3])(this,0xf);
    fl_throw_focus(this);
  }
  return;
}

Assistant:

void Fl_Widget::hide() {
  if (visible_r()) {
    set_flag(INVISIBLE);
    for (Fl_Widget *p = parent(); p; p = p->parent())
      if (p->box() || !p->parent()) {p->redraw(); break;}
    handle(FL_HIDE);
    fl_throw_focus(this);
  } else {
    set_flag(INVISIBLE);
  }
}